

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O2

pair<tsl::detail_robin_hash::robin_hash<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_tsl::robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
 __thiscall
tsl::detail_robin_hash::
robin_hash<std::pair<std::__cxx11::wstring,unsigned_int>,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
::insert_impl<std::__cxx11::wstring,std::pair<std::__cxx11::wstring,unsigned_int>>
          (robin_hash<std::pair<std::__cxx11::wstring,unsigned_int>,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
           *this,basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *key,
          pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>
          *value_type_args)

{
  size_type sVar1;
  __type_conflict _Var2;
  bool bVar3;
  robin_hash<std::pair<std::__cxx11::wstring,unsigned_int>,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
  rVar4;
  size_t sVar5;
  value_type *in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar6;
  truncated_hash_type *ptVar7;
  distance_type dist_from_ideal_bucket;
  ulong ibucket;
  size_t sVar8;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_tsl::robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar9;
  
  sVar5 = std::
          hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          ::operator()((hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                        *)key,&value_type_args->first);
  ibucket = sVar5 & (ulong)(key->_M_dataplus)._M_p;
  dist_from_ideal_bucket = 0;
  do {
    if (*(short *)(key->_M_string_length + 4 + ibucket * 0x30) < dist_from_ideal_bucket) {
      bVar3 = robin_hash<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_tsl::robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
              ::grow_on_high_load((robin_hash<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_tsl::robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                                   *)key);
      sVar1 = key->_M_string_length;
      if (bVar3) {
        sVar8 = sVar5;
        for (dist_from_ideal_bucket = 0; ibucket = sVar8 & (ulong)(key->_M_dataplus)._M_p,
            dist_from_ideal_bucket <= *(short *)(sVar1 + 4 + ibucket * 0x30);
            dist_from_ideal_bucket = dist_from_ideal_bucket + 1) {
          sVar8 = ibucket + 1;
        }
      }
      if (*(short *)(sVar1 + 4 + ibucket * 0x30) == -1) {
        ptVar7 = (truncated_hash_type *)(sVar1 + ibucket * 0x30);
        std::
        pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>
        ::pair((pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>
                *)(ptVar7 + 2),in_RCX);
        *ptVar7 = (truncated_hash_type)sVar5;
        *(distance_type *)(ptVar7 + 1) = dist_from_ideal_bucket;
        uVar6 = extraout_RDX_01;
      }
      else {
        robin_hash<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_tsl::robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
        ::insert_value((robin_hash<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_tsl::robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                        *)key,ibucket,dist_from_ideal_bucket,(truncated_hash_type)sVar5,in_RCX);
        uVar6 = extraout_RDX_00;
      }
      key[1]._M_string_length = key[1]._M_string_length + 1;
      rVar4 = (robin_hash<std::pair<std::__cxx11::wstring,unsigned_int>,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
               )0x1;
LAB_0010b2d8:
      *(ulong *)this = ibucket * 0x30 + key->_M_string_length;
      this[8] = rVar4;
      pVar9._8_8_ = uVar6;
      pVar9.first.m_iterator._M_current = (iterator_bucket)(iterator_bucket)this;
      return pVar9;
    }
    _Var2 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)(key->_M_string_length + ibucket * 0x30 + 8),&value_type_args->first)
    ;
    if (_Var2) {
      rVar4 = (robin_hash<std::pair<std::__cxx11::wstring,unsigned_int>,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
               )0x0;
      uVar6 = extraout_RDX;
      goto LAB_0010b2d8;
    }
    ibucket = ibucket + 1 & (ulong)(key->_M_dataplus)._M_p;
    dist_from_ideal_bucket = dist_from_ideal_bucket + 1;
  } while( true );
}

Assistant:

std::pair<iterator, bool> insert_impl(const K& key, Args&&... value_type_args) {
        const std::size_t hash = hash_key(key);
        
        std::size_t ibucket = bucket_for_hash(hash); 
        distance_type dist_from_ideal_bucket = 0;
        
        while(dist_from_ideal_bucket <= m_buckets[ibucket].dist_from_ideal_bucket()) {
            if((!USE_STORED_HASH_ON_LOOKUP || m_buckets[ibucket].bucket_hash_equal(hash)) &&
               compare_keys(KeySelect()(m_buckets[ibucket].value()), key)) 
            {
                return std::make_pair(iterator(m_buckets.begin() + ibucket), false);
            }
            
            ibucket = next_bucket(ibucket);
            dist_from_ideal_bucket++;
        }
        
        if(grow_on_high_load()) {
            ibucket = bucket_for_hash(hash);
            dist_from_ideal_bucket = 0;
            
            while(dist_from_ideal_bucket <= m_buckets[ibucket].dist_from_ideal_bucket()) {
                ibucket = next_bucket(ibucket);
                dist_from_ideal_bucket++;
            }
        }
 
        
        if(m_buckets[ibucket].empty()) {
            m_buckets[ibucket].set_value_of_empty_bucket(dist_from_ideal_bucket, bucket_entry::truncate_hash(hash),
                                                         std::forward<Args>(value_type_args)...);
        }
        else {
            insert_value(ibucket, dist_from_ideal_bucket, bucket_entry::truncate_hash(hash), 
                         std::forward<Args>(value_type_args)...);
        }
        
        
        m_nb_elements++;
        /*
         * The value will be inserted in ibucket in any case, either because it was
         * empty or by stealing the bucket (robin hood). 
         */
        return std::make_pair(iterator(m_buckets.begin() + ibucket), true);
    }